

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pose.h
# Opt level: O3

Vector6d * gmath::combine(Vector6d *__return_storage_ptr__,Vector6d *pose0,Vector6d *pose1)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  int i;
  long lVar3;
  double (*padVar4) [3];
  int k;
  long lVar5;
  Vector6d *pose;
  double (*padVar6) [3];
  int i_6;
  double (*padVar7) [3];
  int j;
  long lVar8;
  double ret;
  double dVar9;
  SVector<double,_3> ret_2;
  SVector<double,_3> ret_5;
  SVector<double,_3> ret_1;
  Vector3d T;
  Matrix33d R;
  Vector3d local_148;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 local_108;
  Vector3d local_f8;
  Matrix33d local_d8;
  double local_88 [4];
  Matrix33d local_68;
  
  local_148.v[0] = pose0->v[3];
  local_148.v[1] = pose0->v[4];
  local_148.v[2] = pose0->v[5];
  dVar9 = 0.0;
  lVar3 = 0;
  do {
    dVar9 = dVar9 + local_148.v[lVar3] * local_148.v[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  if (dVar9 < 0.0) {
    dVar9 = sqrt(dVar9);
  }
  else {
    dVar9 = SQRT(dVar9);
  }
  if ((dVar9 != 0.0) || (NAN(dVar9))) {
    local_d8.v[0][0] = 0.0;
    local_d8.v[0][1] = 0.0;
    local_d8.v[0][2] = 0.0;
    lVar3 = 0;
    do {
      local_d8.v[0][lVar3] = local_148.v[lVar3] / dVar9;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    createR(&local_68,(Vector3d *)&local_d8,dVar9);
  }
  else {
    local_68.v[1][0] = 0.0;
    local_68.v[1][2] = 0.0;
    local_68.v[2][0] = 0.0;
    local_68.v[0][1] = 0.0;
    local_68.v[0][2] = 0.0;
    local_68.v[2][1] = 0.0;
    local_68.v[0][0] = 1.0;
    local_68.v[1][1] = 1.0;
    local_68.v[2][2] = 1.0;
  }
  local_d8.v[0][0] = pose1->v[0];
  local_d8.v[0][1] = pose1->v[1];
  local_d8.v[0][2] = pose1->v[2];
  local_148.v[0] = 0.0;
  local_148.v[1] = 0.0;
  local_148.v[2] = 0.0;
  padVar4 = (double (*) [3])&local_68;
  lVar3 = 0;
  do {
    dVar9 = local_148.v[lVar3];
    lVar5 = 0;
    do {
      dVar9 = dVar9 + (*(double (*) [3])*padVar4)[lVar5] * local_d8.v[0][lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    local_148.v[lVar3] = dVar9;
    lVar3 = lVar3 + 1;
    padVar4 = padVar4 + 1;
  } while (lVar3 != 3);
  local_f8.v[0] = pose0->v[0];
  local_f8.v[1] = pose0->v[1];
  local_f8.v[2] = pose0->v[2];
  local_88[0] = 0.0;
  local_88[1] = 0.0;
  local_88[2] = 0.0;
  lVar3 = 0;
  do {
    local_88[lVar3] = local_148.v[lVar3] + local_f8.v[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_148.v[0] = pose1->v[3];
  local_148.v[1] = pose1->v[4];
  local_148.v[2] = pose1->v[5];
  dVar9 = 0.0;
  lVar3 = 0;
  do {
    dVar9 = dVar9 + local_148.v[lVar3] * local_148.v[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  if (dVar9 < 0.0) {
    dVar9 = sqrt(dVar9);
  }
  else {
    dVar9 = SQRT(dVar9);
  }
  if ((dVar9 != 0.0) || (NAN(dVar9))) {
    local_f8.v[0] = 0.0;
    local_f8.v[1] = 0.0;
    local_f8.v[2] = 0.0;
    lVar3 = 0;
    do {
      local_f8.v[lVar3] = local_148.v[lVar3] / dVar9;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    createR(&local_d8,&local_f8,dVar9);
  }
  else {
    local_d8.v[1][0] = 0.0;
    local_d8.v[1][2] = 0.0;
    local_d8.v[2][0] = 0.0;
    local_d8.v[0][1] = 0.0;
    local_d8.v[0][2] = 0.0;
    local_d8.v[2][1] = 0.0;
    local_d8.v[0][0] = 1.0;
    local_d8.v[1][1] = 1.0;
    local_d8.v[2][2] = 1.0;
  }
  local_130 = 0;
  local_148.v[1] = 0.0;
  local_148.v[2] = 0.0;
  local_120 = 0;
  uStack_118 = 0;
  local_110 = 0;
  local_148.v[0] = 1.0;
  uStack_128 = 0x3ff0000000000000;
  local_108 = 0x3ff0000000000000;
  padVar4 = (double (*) [3])&local_68;
  lVar3 = 0;
  do {
    lVar5 = 0;
    padVar6 = (double (*) [3])&local_d8;
    do {
      dVar9 = 0.0;
      lVar8 = 0;
      padVar7 = padVar6;
      do {
        dVar9 = dVar9 + (*(double (*) [3])*padVar4)[lVar8] * (*(double (*) [3])*padVar7)[0];
        lVar8 = lVar8 + 1;
        padVar7 = padVar7 + 1;
      } while (lVar8 != 3);
      (&local_148)[lVar3].v[lVar5] = dVar9;
      lVar5 = lVar5 + 1;
      padVar6 = (double (*) [3])(*padVar6 + 1);
    } while (lVar5 != 3);
    lVar3 = lVar3 + 1;
    padVar4 = padVar4 + 1;
  } while (lVar3 != 3);
  lVar3 = 0;
  do {
    *(undefined8 *)((long)local_68.v[0] + lVar3 + 0x10) =
         *(undefined8 *)((long)local_148.v + lVar3 + 0x10);
    uVar2 = *(undefined8 *)((long)local_148.v + lVar3 + 8);
    *(undefined8 *)((long)local_68.v[0] + lVar3) = *(undefined8 *)((long)local_148.v + lVar3);
    *(undefined8 *)((long)local_68.v[0] + lVar3 + 8) = uVar2;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x48);
  local_148.v[2] = 0.0;
  local_148.v[0] = 0.0;
  local_148.v[1] = 0.0;
  dVar9 = recoverAngleAxis(&local_68,&local_148);
  __return_storage_ptr__->v[0] = local_88[0];
  __return_storage_ptr__->v[1] = local_88[1];
  __return_storage_ptr__->v[2] = local_88[2];
  __return_storage_ptr__->v[3] = 0.0;
  __return_storage_ptr__->v[4] = 0.0;
  __return_storage_ptr__->v[5] = 0.0;
  if ((dVar9 != 0.0) || (NAN(dVar9))) {
    auVar1._8_4_ = SUB84(dVar9 * local_148.v[1],0);
    auVar1._0_8_ = dVar9 * local_148.v[0];
    auVar1._12_4_ = (int)((ulong)(dVar9 * local_148.v[1]) >> 0x20);
    *(undefined1 (*) [16])(__return_storage_ptr__->v + 3) = auVar1;
    __return_storage_ptr__->v[5] = dVar9 * local_148.v[2];
  }
  return __return_storage_ptr__;
}

Assistant:

inline Vector6d combine(const Vector6d &pose0, const Vector6d &pose1)
{
  Matrix33d R=getRotation(pose0);
  Vector3d  T=R*getTranslation(pose1)+getTranslation(pose0);
  R=R*getRotation(pose1);
  return getPose(R, T);
}